

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void * op_url_stream_create(OpusFileCallbacks *_cb,char *_url,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  OpusServerInfo *pinfo;
  OpusServerInfo info;
  va_list ap;
  OpusServerInfo *local_120;
  OpusServerInfo local_118;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_78;
  undefined4 local_68;
  undefined4 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Da;
    local_68 = in_XMM2_Da;
    local_58 = in_XMM3_Da;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &pinfo;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  pvVar1 = op_url_stream_vcreate_impl(_cb,_url,&local_118,&local_120,&local_d8);
  if (local_120 != (OpusServerInfo *)0x0) {
    local_120->bitrate_kbps = local_118.bitrate_kbps;
    local_120->is_public = local_118.is_public;
    local_120->is_ssl = local_118.is_ssl;
    *(undefined4 *)&local_120->field_0x3c = local_118._60_4_;
    local_120->server = local_118.server;
    local_120->content_type = local_118.content_type;
    local_120->genre = local_118.genre;
    local_120->url = local_118.url;
    local_120->name = local_118.name;
    local_120->description = local_118.description;
  }
  return pvVar1;
}

Assistant:

void *op_url_stream_create(OpusFileCallbacks *_cb,
 const char *_url,...){
  va_list  ap;
  void    *ret;
  va_start(ap,_url);
  ret=op_url_stream_vcreate(_cb,_url,ap);
  va_end(ap);
  return ret;
}